

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall duckdb::Vector::Slice(Vector *this,SelectionVector *sel,idx_t count,SelCache *cache)

{
  SelectionVector *pSVar1;
  optional_idx oVar2;
  string *psVar3;
  iterator iVar4;
  mapped_type *this_00;
  DictionaryBuffer *this_01;
  idx_t dict_size;
  string dictionary_id;
  sel_t *target_data;
  optional_idx dictionary_size;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  undefined8 local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_80;
  sel_t *local_70;
  optional_idx local_68;
  undefined1 local_60 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  
  if ((this->vector_type == DICTIONARY_VECTOR) && ((this->type).physical_type_ != STRUCT)) {
    pSVar1 = DictionaryVector::SelVector(this);
    oVar2 = DictionaryVector::DictionarySize(this);
    local_68 = oVar2;
    psVar3 = DictionaryVector::DictionaryId_abi_cxx11_(this);
    ::std::__cxx11::string::string((string *)&local_90,(string *)psVar3);
    local_70 = pSVar1->sel_vector;
    iVar4 = ::std::
            _Hashtable<unsigned_int_*,_std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_std::allocator<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int_*>,_std::hash<unsigned_int_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int_*,_std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_std::allocator<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int_*>,_std::hash<unsigned_int_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)cache,&local_70);
    if (iVar4.
        super__Node_iterator_base<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      Slice(this,sel,count);
      this_00 = ::std::__detail::
                _Map_base<unsigned_int_*,_std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_std::allocator<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int_*>,_std::hash<unsigned_int_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int_*,_std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_std::allocator<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int_*>,_std::hash<unsigned_int_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)cache,&local_70);
      shared_ptr<duckdb::VectorBuffer,_true>::operator=(this_00,&this->buffer);
    }
    else {
      shared_ptr<duckdb::VectorBuffer,_true>::operator->
                ((shared_ptr<duckdb::VectorBuffer,_true> *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_false>
                        ._M_cur + 0x10));
      make_shared_ptr<duckdb::DictionaryBuffer,duckdb::SelectionVector&>
                ((SelectionVector *)local_60);
      shared_ptr<duckdb::VectorBuffer,_true>::operator=<duckdb::DictionaryBuffer,_0>
                (&this->buffer,(shared_ptr<duckdb::DictionaryBuffer,_true> *)local_60);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      this->vector_type = DICTIONARY_VECTOR;
    }
    if (oVar2.index != 0xffffffffffffffff) {
      this_01 = (DictionaryBuffer *)
                shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
      dict_size = optional_idx::GetIndex(&local_68);
      DictionaryBuffer::SetDictionarySize(this_01,dict_size);
      local_48 = local_88;
      local_50._M_pi = &local_40;
      if (local_90 == &local_80) {
        local_40._M_use_count = local_80._M_use_count;
        local_40._M_weak_count = local_80._M_weak_count;
      }
      else {
        local_50._M_pi = local_90;
      }
      local_88 = 0;
      local_80._vptr__Sp_counted_base._0_1_ = 0;
      local_90 = &local_80;
      ::std::__cxx11::string::operator=((string *)&this_01->dictionary_id,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    ::std::__cxx11::string::~string((string *)&local_90);
    return;
  }
  Slice(this,sel,count);
  return;
}

Assistant:

void Vector::Slice(const SelectionVector &sel, idx_t count, SelCache &cache) {
	if (GetVectorType() == VectorType::DICTIONARY_VECTOR && GetType().InternalType() != PhysicalType::STRUCT) {
		// dictionary vector: need to merge dictionaries
		// check if we have a cached entry
		auto &current_sel = DictionaryVector::SelVector(*this);
		auto dictionary_size = DictionaryVector::DictionarySize(*this);
		auto dictionary_id = DictionaryVector::DictionaryId(*this);
		auto target_data = current_sel.data();
		auto entry = cache.cache.find(target_data);
		if (entry != cache.cache.end()) {
			// cached entry exists: use that
			this->buffer = make_buffer<DictionaryBuffer>(entry->second->Cast<DictionaryBuffer>().GetSelVector());
			vector_type = VectorType::DICTIONARY_VECTOR;
		} else {
			Slice(sel, count);
			cache.cache[target_data] = this->buffer;
		}
		if (dictionary_size.IsValid()) {
			auto &dict_buffer = buffer->Cast<DictionaryBuffer>();
			dict_buffer.SetDictionarySize(dictionary_size.GetIndex());
			dict_buffer.SetDictionaryId(std::move(dictionary_id));
		}
	} else {
		Slice(sel, count);
	}
}